

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_173::FieldInfoScanner::create(FieldInfoScanner *this)

{
  long in_RSI;
  FieldInfoScanner *this_local;
  
  this_local = (FieldInfoScanner *)this;
  std::
  make_unique<wasm::(anonymous_namespace)::FieldInfoScanner,wasm::StructUtils::FunctionStructValuesMap<wasm::LUBFinder>&,wasm::StructUtils::FunctionStructValuesMap<wasm::LUBFinder>&>
            ((FunctionStructValuesMap<wasm::LUBFinder> *)&stack0xffffffffffffffe0,
             *(FunctionStructValuesMap<wasm::LUBFinder> **)(in_RSI + 0x130));
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::FieldInfoScanner,std::default_delete<wasm::(anonymous_namespace)::FieldInfoScanner>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<wasm::(anonymous_namespace)::FieldInfoScanner,_std::default_delete<wasm::(anonymous_namespace)::FieldInfoScanner>_>
              *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<wasm::(anonymous_namespace)::FieldInfoScanner,_std::default_delete<wasm::(anonymous_namespace)::FieldInfoScanner>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::FieldInfoScanner,_std::default_delete<wasm::(anonymous_namespace)::FieldInfoScanner>_>
                 *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FieldInfoScanner>(functionNewInfos,
                                              functionSetGetInfos);
  }